

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsm-builder.cc
# Opt level: O0

void __thiscall cnn::Cluster::add_word(Cluster *this,uint word)

{
  mapped_type mVar1;
  size_type sVar2;
  mapped_type *pmVar3;
  undefined4 in_ESI;
  value_type_conflict1 *in_RDI;
  key_type *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff0;
  
  sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0xc));
  mVar1 = (mapped_type)sVar2;
  pmVar3 = std::
           unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
           ::operator[]((unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                         *)CONCAT44(mVar1,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8);
  *pmVar3 = mVar1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDI);
  return;
}

Assistant:

void Cluster::add_word(unsigned word) {
  assert (!initialized);
  assert (children.size() == 0);
  word2ind[word] = terminals.size();
  terminals.push_back(word);
}